

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::readCompare
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *values,roaring64_bitmap_t *r,
               uint64_t step)

{
  undefined1 uVar1;
  _Bool _Var2;
  roaring64_iterator_t *it_00;
  uint64_t *puVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  uint64_t step_read;
  uint64_t read;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  roaring64_iterator_t *it;
  int in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  allocator_type *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  uint64_t *buf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  unsigned_long local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  uint64_t *local_60;
  undefined8 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  roaring64_iterator_t *local_20;
  unsigned_long local_18 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  local_8 = in_RDI;
  local_20 = roaring64_iterator_create
                       ((roaring64_bitmap_t *)
                        CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  it_00 = (roaring64_iterator_t *)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
  local_40 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x109c14);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (value_type *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x109c42);
  local_60 = (uint64_t *)0x0;
  while( true ) {
    buf = local_60;
    puVar3 = (uint64_t *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
    if (puVar3 <= buf) break;
    uVar1 = roaring64_iterator_has_value(local_20);
    _assert_true((unsigned_long)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                 (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x109cc6);
    in_stack_ffffffffffffff50 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         roaring64_iterator_read(it_00,buf,CONCAT17(uVar1,in_stack_ffffffffffffff68));
    local_68 = in_stack_ffffffffffffff50;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
    local_70 = sVar4 - (long)local_60;
    std::min<unsigned_long>(local_18,&local_70);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                      (unsigned_long)in_stack_ffffffffffffff48,
                      (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff3c);
    for (local_78 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        local_78 < local_68;
        local_78 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(local_78->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_8,(long)local_60 + (long)local_78);
      in_stack_ffffffffffffff48 = (allocator_type *)*pvVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&local_38,(size_type)local_78);
      _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                        (unsigned_long)in_stack_ffffffffffffff48,
                        (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff3c);
    }
    local_60 = (uint64_t *)
               ((long)&(local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + (long)local_60);
  }
  _Var2 = roaring64_iterator_has_value(local_20);
  _assert_true((unsigned_long)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char *)CONCAT17(_Var2,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  roaring64_iterator_free((roaring64_iterator_t *)0x109e50);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void readCompare(const std::vector<uint64_t>& values,
                 const roaring64_bitmap_t* r, uint64_t step) {
    roaring64_iterator_t* it = roaring64_iterator_create(r);
    std::vector<uint64_t> buffer(values.size(), 0);
    uint64_t read = 0;
    while (read < values.size()) {
        assert_true(roaring64_iterator_has_value(it));
        uint64_t step_read = roaring64_iterator_read(it, buffer.data(), step);
        assert_int_equal(step_read, std::min(step, values.size() - read));
        for (size_t i = 0; i < step_read; ++i) {
            assert_int_equal(values[read + i], buffer[i]);
        }
        read += step_read;
    }
    assert_false(roaring64_iterator_has_value(it));
    roaring64_iterator_free(it);
}